

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::anon_unknown_1::TableArena::~TableArena(TableArena *this)

{
  Block *pBVar1;
  iterator ppBVar2;
  Block *b;
  Block *list;
  iterator __end3;
  iterator __begin3;
  array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *local_18;
  array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *__range3;
  TableArena *this_local;
  
  __range3 = (array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)this;
  GetLists((array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)&__begin3,
           this);
  local_18 = (array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)&__begin3;
  __end3 = std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL>::begin
                     (local_18);
  ppBVar2 = std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL>::end
                      (local_18);
  for (; __end3 != ppBVar2; __end3 = __end3 + 1) {
    b = *__end3;
    while (b != (Block *)0x0) {
      pBVar1 = b->next;
      Block::VisitBlock<google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor>(b);
      Block::Destroy(b);
      b = pBVar1;
    }
  }
  std::
  vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ::~vector(&this->rollback_info_);
  return;
}

Assistant:

~TableArena() {
    // Uncomment this to debug usage statistics of the arena blocks.
    // PrintUsageInfo();

    for (Block* list : GetLists()) {
      while (list != nullptr) {
        Block* b = list;
        list = list->next;
        b->VisitBlock(DestroyVisitor{});
        b->Destroy();
      }
    }
  }